

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_memio.h
# Opt level: O3

bool __thiscall ASDCP::MXF::Rational::Unarchive(Rational *this,MemIOReader *Reader)

{
  byte_t *pbVar1;
  uint uVar2;
  
  if ((ulong)Reader->m_size + 4 <= (ulong)Reader->m_capacity) {
    pbVar1 = Reader->m_p;
    uVar2 = *(uint *)(pbVar1 + Reader->m_size);
    (this->super_Rational).Numerator =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = Reader->m_size + 4;
    Reader->m_size = uVar2;
    if ((ulong)uVar2 + 4 <= (ulong)Reader->m_capacity) {
      uVar2 = *(uint *)(pbVar1 + uVar2);
      (this->super_Rational).Denominator =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      Reader->m_size = Reader->m_size + 4;
      return true;
    }
  }
  return false;
}

Assistant:

inline bool ReadUi32BE(ui32_t* i) {
	assert(i);
	if ( ( m_size + sizeof(ui32_t) ) > m_capacity )
	  return false;

	*i = KM_i32_BE(cp2i<ui32_t>(m_p + m_size));
	m_size += sizeof(ui32_t);
	return true;
      }